

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmc_bounded_q.h
# Opt level: O0

bool __thiscall
spdlog::details::mpmc_bounded_queue<spdlog::details::async_log_helper::async_msg>::enqueue
          (mpmc_bounded_queue<spdlog::details::async_log_helper::async_msg> *this,async_msg *data)

{
  size_t sVar1;
  atomic<unsigned_long> *paVar2;
  cell_t *pcVar3;
  __int_type_conflict _Var4;
  __int_type_conflict _Var5;
  intptr_t dif;
  size_t seq;
  size_t pos;
  cell_t *cell;
  async_msg *data_local;
  mpmc_bounded_queue<spdlog::details::async_log_helper::async_msg> *this_local;
  __int_type_conflict local_c0;
  memory_order local_b8;
  int local_b4;
  memory_order __b_2;
  __int_type_conflict local_a8;
  memory_order local_a0;
  int local_9c;
  memory_order __b_1;
  __int_type_conflict local_90;
  memory_order local_88;
  int local_84;
  memory_order __b;
  undefined4 local_74;
  __int_type_conflict local_70;
  size_t *local_68;
  atomic<unsigned_long> *local_60;
  int local_4c;
  memory_order __b_3;
  size_t local_40;
  bool local_31;
  __int_type_conflict local_30;
  memory_order local_28;
  undefined4 local_24;
  __int_type_conflict local_20;
  size_t *local_18;
  atomic<unsigned_long> *local_10;
  
  paVar2 = &this->enqueue_pos_;
  local_84 = 0;
  cell = (cell_t *)data;
  data_local = (async_msg *)this;
  ___b = paVar2;
  local_88 = std::operator&(memory_order_relaxed,__memory_order_mask);
  if (local_84 - 1U < 2) {
    local_90 = (paVar2->super___atomic_base<unsigned_long>)._M_i;
  }
  else if (local_84 == 5) {
    local_90 = (paVar2->super___atomic_base<unsigned_long>)._M_i;
  }
  else {
    local_90 = (paVar2->super___atomic_base<unsigned_long>)._M_i;
  }
  seq = local_90;
  do {
    while( true ) {
      pcVar3 = this->buffer_ + (seq & this->buffer_mask_);
      local_9c = 2;
      pos = (size_t)pcVar3;
      ___b_1 = pcVar3;
      local_a0 = std::operator&(memory_order_acquire,__memory_order_mask);
      if (local_9c - 1U < 2) {
        local_a8 = (pcVar3->sequence_).super___atomic_base<unsigned_long>._M_i;
      }
      else if (local_9c == 5) {
        local_a8 = (pcVar3->sequence_).super___atomic_base<unsigned_long>._M_i;
      }
      else {
        local_a8 = (pcVar3->sequence_).super___atomic_base<unsigned_long>._M_i;
      }
      if (local_a8 == seq) break;
      if ((long)(local_a8 - seq) < 0) {
        return false;
      }
      paVar2 = &this->enqueue_pos_;
      local_b4 = 0;
      ___b_2 = paVar2;
      local_b8 = std::operator&(memory_order_relaxed,__memory_order_mask);
      if (local_b4 - 1U < 2) {
        local_c0 = (paVar2->super___atomic_base<unsigned_long>)._M_i;
      }
      else if (local_b4 == 5) {
        local_c0 = (paVar2->super___atomic_base<unsigned_long>)._M_i;
      }
      else {
        local_c0 = (paVar2->super___atomic_base<unsigned_long>)._M_i;
      }
      seq = local_c0;
    }
    paVar2 = &this->enqueue_pos_;
    _Var4 = seq + 1;
    local_74 = 0;
    local_70 = _Var4;
    local_68 = &seq;
    local_60 = paVar2;
    local_28 = std::__cmpexch_failure_order(memory_order_relaxed);
    local_24 = 0;
    if (local_28 - memory_order_consume < 2) {
      LOCK();
      _Var5 = (paVar2->super___atomic_base<unsigned_long>)._M_i;
      local_31 = seq == _Var5;
      if (local_31) {
        (paVar2->super___atomic_base<unsigned_long>)._M_i = _Var4;
        _Var5 = seq;
      }
      UNLOCK();
      if (!local_31) {
        seq = _Var5;
      }
    }
    else if (local_28 == memory_order_seq_cst) {
      LOCK();
      _Var5 = (paVar2->super___atomic_base<unsigned_long>)._M_i;
      local_31 = seq == _Var5;
      if (local_31) {
        (paVar2->super___atomic_base<unsigned_long>)._M_i = _Var4;
        _Var5 = seq;
      }
      UNLOCK();
      if (!local_31) {
        seq = _Var5;
      }
    }
    else {
      LOCK();
      _Var5 = (paVar2->super___atomic_base<unsigned_long>)._M_i;
      local_31 = seq == _Var5;
      if (local_31) {
        (paVar2->super___atomic_base<unsigned_long>)._M_i = _Var4;
        _Var5 = seq;
      }
      UNLOCK();
      if (!local_31) {
        seq = _Var5;
      }
    }
    local_30 = _Var4;
    local_20 = _Var4;
    local_18 = &seq;
    local_10 = paVar2;
  } while (local_31 == false);
  async_log_helper::async_msg::operator=((async_msg *)(pos + 8),(async_msg *)cell);
  sVar1 = pos;
  ___b_3 = seq + 1;
  local_40 = pos;
  local_4c = 3;
  std::operator&(memory_order_release,__memory_order_mask);
  if (local_4c == 3) {
    *(long *)sVar1 = ___b_3;
  }
  else if (local_4c == 5) {
    LOCK();
    *(long *)sVar1 = ___b_3;
    UNLOCK();
  }
  else {
    *(long *)sVar1 = ___b_3;
  }
  return true;
}

Assistant:

bool enqueue(T &&data)
    {
        cell_t *cell;
        size_t pos = enqueue_pos_.load(std::memory_order_relaxed);
        for (;;)
        {
            cell = &buffer_[pos & buffer_mask_];
            size_t seq = cell->sequence_.load(std::memory_order_acquire);
            intptr_t dif = static_cast<intptr_t>(seq) - static_cast<intptr_t>(pos);
            if (dif == 0)
            {
                if (enqueue_pos_.compare_exchange_weak(pos, pos + 1, std::memory_order_relaxed))
                {
                    break;
                }
            }
            else if (dif < 0)
            {
                return false;
            }
            else
            {
                pos = enqueue_pos_.load(std::memory_order_relaxed);
            }
        }
        cell->data_ = std::move(data);
        cell->sequence_.store(pos + 1, std::memory_order_release);
        return true;
    }